

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::FileOptions::InternalSerializeWithCachedSizesToArray
          (FileOptions *this,uint8 *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint32 uVar2;
  uint uVar3;
  uint32 uVar4;
  uint8 *puVar5;
  UninterpretedOption *in_RDX;
  uint8 *in_RSI;
  FileOptions *in_RDI;
  uint n;
  uint i;
  uint32 cached_has_bits;
  uint8 **in_stack_fffffffffffffc28;
  FileOptions *in_stack_fffffffffffffc30;
  UninterpretedOption *in_stack_fffffffffffffc48;
  string *in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffc58;
  UninterpretedOption *pUVar6;
  EpsCopyOutputStream *in_stack_fffffffffffffc60;
  UninterpretedOption *in_stack_fffffffffffffc68;
  EpsCopyOutputStream *in_stack_fffffffffffffc70;
  UninterpretedOption *in_stack_fffffffffffffc78;
  uint8 *in_stack_fffffffffffffc80;
  UninterpretedOption *in_stack_fffffffffffffc88;
  uint local_320;
  uint8 *local_310;
  
  uVar4 = (uint32)((ulong)in_stack_fffffffffffffc58 >> 0x20);
  uVar3 = (in_RDI->_has_bits_).has_bits_[0];
  local_310 = in_RSI;
  if ((uVar3 & 1) != 0) {
    _internal_java_package_abi_cxx11_((FileOptions *)0x50712b);
    std::__cxx11::string::data();
    _internal_java_package_abi_cxx11_((FileOptions *)0x507148);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
               (Operation)in_stack_fffffffffffffc28,(char *)0x50716b);
    _internal_java_package_abi_cxx11_((FileOptions *)0x507188);
    local_310 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                          (in_stack_fffffffffffffc60,uVar4,in_stack_fffffffffffffc50,
                           (uint8 *)in_stack_fffffffffffffc48);
  }
  if ((uVar3 & 2) != 0) {
    _internal_java_outer_classname_abi_cxx11_((FileOptions *)0x5071cd);
    std::__cxx11::string::data();
    _internal_java_outer_classname_abi_cxx11_((FileOptions *)0x5071ea);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
               (Operation)in_stack_fffffffffffffc28,(char *)0x50720d);
    _internal_java_outer_classname_abi_cxx11_((FileOptions *)0x50722a);
    local_310 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                          (in_stack_fffffffffffffc60,uVar4,in_stack_fffffffffffffc50,
                           (uint8 *)in_stack_fffffffffffffc48);
  }
  if ((uVar3 & 0x80000) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    _internal_optimize_for(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(9,WIRETYPE_VARINT);
    io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_310);
    local_310 = io::CodedOutputStream::WriteVarint32SignExtendedToArray
                          ((int32)((ulong)in_stack_fffffffffffffc30 >> 0x20),
                           (uint8 *)in_stack_fffffffffffffc28);
  }
  if ((uVar3 & 0x400) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    bVar1 = _internal_java_multiple_files(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(10,WIRETYPE_VARINT);
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_310);
    local_310 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,puVar5);
  }
  if ((uVar3 & 4) != 0) {
    _internal_go_package_abi_cxx11_((FileOptions *)0x50748e);
    std::__cxx11::string::data();
    _internal_go_package_abi_cxx11_((FileOptions *)0x5074a8);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
               (Operation)in_stack_fffffffffffffc28,(char *)0x5074c8);
    _internal_go_package_abi_cxx11_((FileOptions *)0x5074e5);
    local_310 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                          (in_stack_fffffffffffffc60,uVar4,in_stack_fffffffffffffc50,
                           (uint8 *)in_stack_fffffffffffffc48);
  }
  if ((uVar3 & 0x2000) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    bVar1 = _internal_cc_generic_services(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(0x10,WIRETYPE_VARINT);
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_310);
    local_310 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,puVar5);
  }
  if ((uVar3 & 0x4000) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    bVar1 = _internal_java_generic_services(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(0x11,WIRETYPE_VARINT);
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_310);
    local_310 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,puVar5);
  }
  if ((uVar3 & 0x8000) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    bVar1 = _internal_py_generic_services(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(0x12,WIRETYPE_VARINT);
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_310);
    local_310 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,puVar5);
  }
  if ((uVar3 & 0x800) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    bVar1 = _internal_java_generate_equals_and_hash(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(0x14,WIRETYPE_VARINT);
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_310);
    local_310 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,puVar5);
  }
  if ((uVar3 & 0x20000) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    bVar1 = _internal_deprecated(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(0x17,WIRETYPE_VARINT);
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_310);
    local_310 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,puVar5);
  }
  if ((uVar3 & 0x1000) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    bVar1 = _internal_java_string_check_utf8(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(0x1b,WIRETYPE_VARINT);
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_310);
    local_310 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,puVar5);
  }
  if ((uVar3 & 0x40000) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    bVar1 = _internal_cc_enable_arenas(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(0x1f,WIRETYPE_VARINT);
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_310);
    local_310 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,puVar5);
  }
  if ((uVar3 & 8) != 0) {
    _internal_objc_class_prefix_abi_cxx11_((FileOptions *)0x507cd9);
    std::__cxx11::string::data();
    _internal_objc_class_prefix_abi_cxx11_((FileOptions *)0x507cf3);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
               (Operation)in_stack_fffffffffffffc28,(char *)0x507d13);
    _internal_objc_class_prefix_abi_cxx11_((FileOptions *)0x507d2d);
    local_310 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                          (in_stack_fffffffffffffc60,uVar4,in_stack_fffffffffffffc50,
                           (uint8 *)in_stack_fffffffffffffc48);
  }
  if ((uVar3 & 0x10) != 0) {
    _internal_csharp_namespace_abi_cxx11_((FileOptions *)0x507d6f);
    in_stack_fffffffffffffc80 = (uint8 *)std::__cxx11::string::data();
    _internal_csharp_namespace_abi_cxx11_((FileOptions *)0x507d89);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
               (Operation)in_stack_fffffffffffffc28,(char *)0x507da9);
    in_stack_fffffffffffffc88 = in_RDX;
    _internal_csharp_namespace_abi_cxx11_((FileOptions *)0x507dc3);
    local_310 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                          (in_stack_fffffffffffffc60,uVar4,in_stack_fffffffffffffc50,
                           (uint8 *)in_stack_fffffffffffffc48);
  }
  if ((uVar3 & 0x20) != 0) {
    _internal_swift_prefix_abi_cxx11_((FileOptions *)0x507e05);
    in_stack_fffffffffffffc70 = (EpsCopyOutputStream *)std::__cxx11::string::data();
    _internal_swift_prefix_abi_cxx11_((FileOptions *)0x507e1f);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
               (Operation)in_stack_fffffffffffffc28,(char *)0x507e3f);
    in_stack_fffffffffffffc78 = in_RDX;
    _internal_swift_prefix_abi_cxx11_((FileOptions *)0x507e59);
    local_310 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                          (in_stack_fffffffffffffc60,uVar4,in_stack_fffffffffffffc50,
                           (uint8 *)in_stack_fffffffffffffc48);
  }
  if ((uVar3 & 0x40) != 0) {
    _internal_php_class_prefix_abi_cxx11_((FileOptions *)0x507e9b);
    in_stack_fffffffffffffc60 = (EpsCopyOutputStream *)std::__cxx11::string::data();
    _internal_php_class_prefix_abi_cxx11_((FileOptions *)0x507eb5);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
               (Operation)in_stack_fffffffffffffc28,(char *)0x507ed5);
    in_stack_fffffffffffffc68 = in_RDX;
    _internal_php_class_prefix_abi_cxx11_((FileOptions *)0x507eef);
    local_310 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                          (in_stack_fffffffffffffc60,uVar4,in_stack_fffffffffffffc50,
                           (uint8 *)in_stack_fffffffffffffc48);
  }
  if ((uVar3 & 0x80) != 0) {
    _internal_php_namespace_abi_cxx11_((FileOptions *)0x507f33);
    in_stack_fffffffffffffc50 = (string *)std::__cxx11::string::data();
    _internal_php_namespace_abi_cxx11_((FileOptions *)0x507f4d);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
               (Operation)in_stack_fffffffffffffc28,(char *)0x507f6d);
    pUVar6 = in_RDX;
    _internal_php_namespace_abi_cxx11_((FileOptions *)0x507f87);
    uVar4 = (uint32)((ulong)pUVar6 >> 0x20);
    local_310 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                          (in_stack_fffffffffffffc60,uVar4,in_stack_fffffffffffffc50,
                           (uint8 *)in_stack_fffffffffffffc48);
  }
  if ((uVar3 & 0x10000) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    bVar1 = _internal_php_generic_services(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(0x2a,WIRETYPE_VARINT);
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_310);
    local_310 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,puVar5);
  }
  if ((uVar3 & 0x100) != 0) {
    _internal_php_metadata_namespace_abi_cxx11_((FileOptions *)0x5080e4);
    std::__cxx11::string::data();
    _internal_php_metadata_namespace_abi_cxx11_((FileOptions *)0x5080fe);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
               (Operation)in_stack_fffffffffffffc28,(char *)0x50811e);
    _internal_php_metadata_namespace_abi_cxx11_((FileOptions *)0x508138);
    local_310 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                          (in_stack_fffffffffffffc60,uVar4,in_stack_fffffffffffffc50,(uint8 *)in_RDX
                          );
    in_stack_fffffffffffffc48 = in_RDX;
  }
  if ((uVar3 & 0x200) != 0) {
    _internal_ruby_package_abi_cxx11_((FileOptions *)0x50817c);
    in_stack_fffffffffffffc30 = (FileOptions *)std::__cxx11::string::data();
    _internal_ruby_package_abi_cxx11_((FileOptions *)0x508196);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
               (Operation)in_stack_fffffffffffffc28,(char *)0x5081b6);
    _internal_ruby_package_abi_cxx11_((FileOptions *)0x5081d0);
    local_310 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                          (in_stack_fffffffffffffc60,uVar4,in_stack_fffffffffffffc50,
                           (uint8 *)in_stack_fffffffffffffc48);
  }
  local_320 = 0;
  uVar3 = _internal_uninterpreted_option_size((FileOptions *)0x50820a);
  for (; local_320 < uVar3; local_320 = local_320 + 1) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    _internal_uninterpreted_option
              (in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20));
    uVar4 = internal::WireFormatLite::MakeTag(999,WIRETYPE_LENGTH_DELIMITED);
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar4,local_310);
    uVar4 = UninterpretedOption::GetCachedSize((UninterpretedOption *)0x508302);
    io::CodedOutputStream::WriteVarint32ToArray(uVar4,puVar5);
    local_310 = UninterpretedOption::InternalSerializeWithCachedSizesToArray
                          (in_stack_fffffffffffffc78,(uint8 *)in_stack_fffffffffffffc70,
                           (EpsCopyOutputStream *)in_stack_fffffffffffffc68);
  }
  local_310 = internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
                        ((ExtensionSet *)in_stack_fffffffffffffc88,
                         (int)((ulong)in_stack_fffffffffffffc80 >> 0x20),
                         (int)in_stack_fffffffffffffc80,(uint8 *)in_stack_fffffffffffffc78,
                         in_stack_fffffffffffffc70);
  if (((uint)(in_RDI->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    if (((uint)(in_RDI->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)&in_RDI->_internal_metadata_);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    local_310 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                          ((UnknownFieldSet *)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
                           (EpsCopyOutputStream *)in_stack_fffffffffffffc78);
  }
  return local_310;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* FileOptions::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FileOptions)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string java_package = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_java_package().data(), static_cast<int>(this->_internal_java_package().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.java_package");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_java_package(), target);
  }

  // optional string java_outer_classname = 8;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_java_outer_classname().data(), static_cast<int>(this->_internal_java_outer_classname().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.java_outer_classname");
    target = stream->WriteStringMaybeAliased(
        8, this->_internal_java_outer_classname(), target);
  }

  // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
  if (cached_has_bits & 0x00080000u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      9, this->_internal_optimize_for(), target);
  }

  // optional bool java_multiple_files = 10 [default = false];
  if (cached_has_bits & 0x00000400u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(10, this->_internal_java_multiple_files(), target);
  }

  // optional string go_package = 11;
  if (cached_has_bits & 0x00000004u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_go_package().data(), static_cast<int>(this->_internal_go_package().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.go_package");
    target = stream->WriteStringMaybeAliased(
        11, this->_internal_go_package(), target);
  }

  // optional bool cc_generic_services = 16 [default = false];
  if (cached_has_bits & 0x00002000u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(16, this->_internal_cc_generic_services(), target);
  }

  // optional bool java_generic_services = 17 [default = false];
  if (cached_has_bits & 0x00004000u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(17, this->_internal_java_generic_services(), target);
  }

  // optional bool py_generic_services = 18 [default = false];
  if (cached_has_bits & 0x00008000u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(18, this->_internal_py_generic_services(), target);
  }

  // optional bool java_generate_equals_and_hash = 20 [deprecated = true];
  if (cached_has_bits & 0x00000800u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(20, this->_internal_java_generate_equals_and_hash(), target);
  }

  // optional bool deprecated = 23 [default = false];
  if (cached_has_bits & 0x00020000u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(23, this->_internal_deprecated(), target);
  }

  // optional bool java_string_check_utf8 = 27 [default = false];
  if (cached_has_bits & 0x00001000u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(27, this->_internal_java_string_check_utf8(), target);
  }

  // optional bool cc_enable_arenas = 31 [default = false];
  if (cached_has_bits & 0x00040000u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(31, this->_internal_cc_enable_arenas(), target);
  }

  // optional string objc_class_prefix = 36;
  if (cached_has_bits & 0x00000008u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_objc_class_prefix().data(), static_cast<int>(this->_internal_objc_class_prefix().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.objc_class_prefix");
    target = stream->WriteStringMaybeAliased(
        36, this->_internal_objc_class_prefix(), target);
  }

  // optional string csharp_namespace = 37;
  if (cached_has_bits & 0x00000010u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_csharp_namespace().data(), static_cast<int>(this->_internal_csharp_namespace().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.csharp_namespace");
    target = stream->WriteStringMaybeAliased(
        37, this->_internal_csharp_namespace(), target);
  }

  // optional string swift_prefix = 39;
  if (cached_has_bits & 0x00000020u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_swift_prefix().data(), static_cast<int>(this->_internal_swift_prefix().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.swift_prefix");
    target = stream->WriteStringMaybeAliased(
        39, this->_internal_swift_prefix(), target);
  }

  // optional string php_class_prefix = 40;
  if (cached_has_bits & 0x00000040u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_php_class_prefix().data(), static_cast<int>(this->_internal_php_class_prefix().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.php_class_prefix");
    target = stream->WriteStringMaybeAliased(
        40, this->_internal_php_class_prefix(), target);
  }

  // optional string php_namespace = 41;
  if (cached_has_bits & 0x00000080u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_php_namespace().data(), static_cast<int>(this->_internal_php_namespace().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.php_namespace");
    target = stream->WriteStringMaybeAliased(
        41, this->_internal_php_namespace(), target);
  }

  // optional bool php_generic_services = 42 [default = false];
  if (cached_has_bits & 0x00010000u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(42, this->_internal_php_generic_services(), target);
  }

  // optional string php_metadata_namespace = 44;
  if (cached_has_bits & 0x00000100u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_php_metadata_namespace().data(), static_cast<int>(this->_internal_php_metadata_namespace().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.php_metadata_namespace");
    target = stream->WriteStringMaybeAliased(
        44, this->_internal_php_metadata_namespace(), target);
  }

  // optional string ruby_package = 45;
  if (cached_has_bits & 0x00000200u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_ruby_package().data(), static_cast<int>(this->_internal_ruby_package().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.ruby_package");
    target = stream->WriteStringMaybeAliased(
        45, this->_internal_ruby_package(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_uninterpreted_option_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(999, this->_internal_uninterpreted_option(i), target, stream);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.InternalSerializeWithCachedSizesToArray(
      1000, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FileOptions)
  return target;
}